

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void selectWindowRewriteEList
               (Parse *pParse,Window *pWin,SrcList *pSrc,ExprList *pEList,Table *pTab,
               ExprList **ppSub)

{
  long in_FS_OFFSET;
  Window *local_70;
  SrcList *local_68;
  ExprList *local_60;
  Table *local_58;
  undefined8 local_50;
  Walker local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.u.pNC = (NameContext *)&local_70;
  local_50 = 0;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48.mWFlags = 0;
  local_60 = *ppSub;
  local_48.xExprCallback = selectWindowRewriteExprCb;
  local_48.xSelectCallback = selectWindowRewriteSelectCb;
  local_70 = pWin;
  local_68 = pSrc;
  local_58 = pTab;
  local_48.pParse = pParse;
  sqlite3WalkExprList(&local_48,pEList);
  *ppSub = local_60;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void selectWindowRewriteEList(
  Parse *pParse,
  Window *pWin,
  SrcList *pSrc,
  ExprList *pEList,               /* Rewrite expressions in this list */
  Table *pTab,
  ExprList **ppSub                /* IN/OUT: Sub-select expression-list */
){
  Walker sWalker;
  WindowRewrite sRewrite;

  assert( pWin!=0 );
  memset(&sWalker, 0, sizeof(Walker));
  memset(&sRewrite, 0, sizeof(WindowRewrite));

  sRewrite.pSub = *ppSub;
  sRewrite.pWin = pWin;
  sRewrite.pSrc = pSrc;
  sRewrite.pTab = pTab;

  sWalker.pParse = pParse;
  sWalker.xExprCallback = selectWindowRewriteExprCb;
  sWalker.xSelectCallback = selectWindowRewriteSelectCb;
  sWalker.u.pRewrite = &sRewrite;

  (void)sqlite3WalkExprList(&sWalker, pEList);

  *ppSub = sRewrite.pSub;
}